

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

void js_std_free_handlers(JSRuntime *rt)

{
  JSWorkerMessagePipe *pJVar1;
  JSRuntime *pJVar2;
  void *pvVar3;
  void *__ptr;
  JSRuntime *in_RDI;
  JSOSTimer *th;
  JSOSSignalHandler *sh;
  JSOSRWHandler *rh;
  list_head *el1;
  list_head *el;
  JSThreadState *ts;
  JSOSRWHandler *in_stack_ffffffffffffffc8;
  JSRuntime *in_stack_ffffffffffffffd0;
  void *pvVar4;
  JSRuntime *pJVar5;
  JSWorkerMessagePipe *ps;
  JSRuntime *local_18;
  
  __ptr = JS_GetRuntimeOpaque(in_RDI);
  pvVar3 = *(void **)((long)*(void **)((long)__ptr + 8) + 8);
  local_18 = (JSRuntime *)*(void **)((long)__ptr + 8);
  while (pvVar4 = pvVar3, local_18 != (JSRuntime *)__ptr) {
    free_rw_handler(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    pvVar3 = *(void **)((long)pvVar4 + 8);
    local_18 = (JSRuntime *)pvVar4;
  }
  pJVar2 = (JSRuntime *)((*(JSRuntime **)((long)__ptr + 0x18))->mf).js_free;
  local_18 = *(JSRuntime **)((long)__ptr + 0x18);
  while (pJVar5 = pJVar2, local_18 != (JSRuntime *)((long)__ptr + 0x10)) {
    free_sh(local_18,(JSOSSignalHandler *)in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffd0 = local_18;
    pJVar2 = (JSRuntime *)(pJVar5->mf).js_free;
    local_18 = pJVar5;
  }
  pJVar1 = *(JSWorkerMessagePipe **)&(*(JSWorkerMessagePipe **)((long)__ptr + 0x28))->mutex;
  local_18 = (JSRuntime *)*(JSWorkerMessagePipe **)((long)__ptr + 0x28);
  while (ps = pJVar1, local_18 != (JSRuntime *)((long)__ptr + 0x20)) {
    unlink_timer(in_stack_ffffffffffffffd0,(JSOSTimer *)local_18);
    if ((((JSWorkerMessagePipe *)local_18)->mutex).__data.__owner == 0) {
      free_timer(in_stack_ffffffffffffffd0,(JSOSTimer *)local_18);
    }
    pJVar1 = *(JSWorkerMessagePipe **)&ps->mutex;
    local_18 = (JSRuntime *)ps;
  }
  js_free_message_pipe(ps);
  js_free_message_pipe(ps);
  free(__ptr);
  JS_SetRuntimeOpaque(in_RDI,(void *)0x0);
  return;
}

Assistant:

void js_std_free_handlers(JSRuntime *rt)
{
    JSThreadState *ts = JS_GetRuntimeOpaque(rt);
    struct list_head *el, *el1;

    list_for_each_safe(el, el1, &ts->os_rw_handlers) {
        JSOSRWHandler *rh = list_entry(el, JSOSRWHandler, link);
        free_rw_handler(rt, rh);
    }

    list_for_each_safe(el, el1, &ts->os_signal_handlers) {
        JSOSSignalHandler *sh = list_entry(el, JSOSSignalHandler, link);
        free_sh(rt, sh);
    }
    
    list_for_each_safe(el, el1, &ts->os_timers) {
        JSOSTimer *th = list_entry(el, JSOSTimer, link);
        unlink_timer(rt, th);
        if (!th->has_object)
            free_timer(rt, th);
    }

#ifdef USE_WORKER
    /* XXX: free port_list ? */
    js_free_message_pipe(ts->recv_pipe);
    js_free_message_pipe(ts->send_pipe);
#endif

    free(ts);
    JS_SetRuntimeOpaque(rt, NULL); /* fail safe */
}